

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlRelaxNGValidCtxtPtrWrap(xmlRelaxNGValidCtxtPtr valid)

{
  PyObject *ret;
  xmlRelaxNGValidCtxtPtr valid_local;
  
  if (valid == (xmlRelaxNGValidCtxtPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    valid_local = (xmlRelaxNGValidCtxtPtr)&_Py_NoneStruct;
  }
  else {
    valid_local = (xmlRelaxNGValidCtxtPtr)PyCapsule_New(valid,"xmlRelaxNGValidCtxtPtr",0);
  }
  return (PyObject *)valid_local;
}

Assistant:

PyObject *
libxml_xmlRelaxNGValidCtxtPtrWrap(xmlRelaxNGValidCtxtPtr valid)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlRelaxNGValidCtxtPtrWrap: valid = %p\n", valid);
#endif
    if (valid == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret =
        PyCapsule_New((void *) valid,
                                     (char *) "xmlRelaxNGValidCtxtPtr", NULL);
    return (ret);
}